

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O2

void __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::show_stats
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,ostream *os,
          int n)

{
  undefined1 auVar1 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar2 [16];
  undefined1 in_ZMM1 [64];
  string indent;
  double local_48;
  string local_40;
  
  auVar2 = in_ZMM1._0_16_;
  auVar1 = in_ZMM0._0_16_;
  get_indent_abi_cxx11_(&local_40,(poplar *)(ulong)(uint)n,n);
  show_stat<char[19]>(os,&local_40,"name",(char (*) [19])"compact_hash_table");
  auVar1 = vcvtusi2sd_avx512f(auVar1,this->size_);
  auVar2 = vcvtusi2sd_avx512f(auVar2,(this->capa_size_).mask_ + 1);
  local_48 = (auVar1._0_8_ / auVar2._0_8_) * 100.0;
  show_stat<double>(os,&local_40,"factor",&local_48);
  local_48 = (double)CONCAT44(local_48._4_4_,0x50);
  show_stat<unsigned_int>(os,&local_40,"max_factor",(uint *)&local_48);
  local_48 = (double)this->size_;
  show_stat<unsigned_long>(os,&local_40,"size",(unsigned_long *)&local_48);
  local_48 = (double)((this->capa_size_).mask_ + 1);
  show_stat<unsigned_long>(os,&local_40,"capa_size",(unsigned_long *)&local_48);
  local_48 = (double)((long)(this->table_).chunks_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                     (long)(this->table_).chunks_.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start);
  show_stat<unsigned_long>(os,&local_40,"alloc_bytes",(unsigned_long *)&local_48);
  show_member(os,&local_40,"hasher_");
  bijective_hash::split_mix_hasher::show_stats(&this->hasher_,os,n + 1);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void show_stats(std::ostream& os, int n = 0) const {
        auto indent = get_indent(n);
        show_stat(os, indent, "name", "compact_hash_table");
        show_stat(os, indent, "factor", double(size()) / capa_size() * 100);
        show_stat(os, indent, "max_factor", MaxFactor);
        show_stat(os, indent, "size", size());
        show_stat(os, indent, "capa_size", capa_size());
        show_stat(os, indent, "alloc_bytes", alloc_bytes());
#ifdef POPLAR_EXTRA_STATS
        show_stat(os, indent, "num_resize", num_resize_);
#endif
        show_member(os, indent, "hasher_");
        hasher_.show_stats(os, n + 1);
    }